

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.hpp
# Opt level: O0

void __thiscall
dxil_spv::OptionInstructionInstrumentation::OptionInstructionInstrumentation
          (OptionInstructionInstrumentation *this)

{
  OptionInstructionInstrumentation *this_local;
  
  OptionBase::OptionBase(&this->super_OptionBase,InstructionInstrumentation);
  this->enabled = false;
  this->version = 1;
  this->control_desc_set = 0;
  this->control_binding = 0;
  this->payload_desc_set = 0;
  this->payload_binding = 0;
  this->shader_hash = 0;
  this->type = FullNanInf;
  return;
}

Assistant:

OptionInstructionInstrumentation()
	    : OptionBase(Option::InstructionInstrumentation)
	{
	}